

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_handlers.c
# Opt level: O3

dropt_error
dropt_handle_uint(dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  dropt_error dVar1;
  char *in_RAX;
  int *piVar2;
  ulong uVar3;
  dropt_char *end;
  char *local_28;
  
  if (dest == (void *)0x0) {
    dropt_misuse("No handler destination specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_handlers.c"
                 ,0x123);
    dVar1 = 2;
  }
  else {
    dVar1 = 5;
    if ((optionArgument != (dropt_char *)0x0) && (*optionArgument != '\0')) {
      if (*optionArgument == '-') {
        dVar1 = 6;
      }
      else {
        local_28 = in_RAX;
        piVar2 = __errno_location();
        *piVar2 = 0;
        uVar3 = strtoul(optionArgument,&local_28,10);
        dVar1 = 6;
        if ((optionArgument < local_28) && (*local_28 == '\0')) {
          dVar1 = 7;
          if ((uVar3 >> 0x20 == 0 && *piVar2 != 0x22) && (dVar1 = 1, *piVar2 == 0)) {
            *(int *)dest = (int)uVar3;
            dVar1 = 0;
          }
        }
      }
    }
  }
  return dVar1;
}

Assistant:

dropt_error
dropt_handle_uint(dropt_context* context,
                  const dropt_option* option,
                  const dropt_char* optionArgument,
                  void* dest)
{
    dropt_error err = dropt_error_none;
    int val = 0;
    unsigned int* out = dest;

    if (out == NULL)
    {
        DROPT_MISUSE("No handler destination specified.");
        err = dropt_error_bad_configuration;
    }
    else if (   optionArgument == NULL
             || optionArgument[0] == DROPT_TEXT_LITERAL('\0'))
    {
        err = dropt_error_insufficient_arguments;
    }
    else if (optionArgument[0] == DROPT_TEXT_LITERAL('-'))
    {
        err = dropt_error_mismatch;
    }
    else
    {
        dropt_char* end;
        unsigned long n;
        errno = 0;
        n = dropt_strtoul(optionArgument, &end, 10);

        /* Check that we matched at least one digit.
         * (`strtol`/`strtoul` will return 0 if fed a string with no digits.)
         */
        if (*end == DROPT_TEXT_LITERAL('\0') && end > optionArgument)
        {
            if (errno == ERANGE || n > UINT_MAX)
            {
                err = dropt_error_overflow;
                val = UINT_MAX;
            }
            else if (errno == 0)
            {
                val = (unsigned int) n;
            }
            else
            {
                err = dropt_error_unknown;
            }
        }
        else
        {
            err = dropt_error_mismatch;
        }
    }

    if (err == dropt_error_none) { *out = val; }
    return err;
}